

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build.cc
# Opt level: O2

bool __thiscall Plan::CleanNode(Plan *this,DependencyScan *scan,Node *node,string *err)

{
  pointer ppEVar1;
  key_type pEVar2;
  Edge *this_00;
  bool bVar3;
  iterator iVar4;
  __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_> _Var5;
  Node *most_recent_input;
  iterator i;
  Node **ppNVar6;
  pointer ppNVar7;
  Node **ppNVar8;
  pointer __k;
  bool outputs_dirty;
  bool local_51;
  DependencyScan *local_50;
  string *local_48;
  _Base_ptr local_40;
  Node *local_38;
  
  node->dirty_ = false;
  local_40 = &(this->want_)._M_t._M_impl.super__Rb_tree_header._M_header;
  local_50 = scan;
  local_48 = err;
  local_38 = node;
  for (__k = (node->out_edges_).super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
             super__Vector_impl_data._M_start;
      ppEVar1 = (local_38->out_edges_).super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
                super__Vector_impl_data._M_finish, __k != ppEVar1; __k = __k + 1) {
    iVar4 = std::
            _Rb_tree<Edge_*,_std::pair<Edge_*const,_Plan::Want>,_std::_Select1st<std::pair<Edge_*const,_Plan::Want>_>,_std::less<Edge_*>,_std::allocator<std::pair<Edge_*const,_Plan::Want>_>_>
            ::find((_Rb_tree<Edge_*,_std::pair<Edge_*const,_Plan::Want>,_std::_Select1st<std::pair<Edge_*const,_Plan::Want>_>,_std::less<Edge_*>,_std::allocator<std::pair<Edge_*const,_Plan::Want>_>_>
                    *)this,__k);
    if (((iVar4._M_node != local_40) && (*(int *)&iVar4._M_node[1]._M_parent != 0)) &&
       (pEVar2 = *__k, pEVar2->deps_missing_ == false)) {
      ppNVar6 = (pEVar2->inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      ppNVar8 = (pEVar2->inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                super__Vector_impl_data._M_finish + -(long)pEVar2->order_only_deps_;
      _Var5 = std::
              __find_if<__gnu_cxx::__normal_iterator<Node**,std::vector<Node*,std::allocator<Node*>>>,__gnu_cxx::__ops::_Iter_pred<std::_Mem_fn<bool(Node::*)()const>>>
                        (ppNVar6,ppNVar8,Node::dirty,0);
      if (_Var5._M_current == ppNVar8) {
        most_recent_input = (Node *)0x0;
        for (; ppNVar6 != ppNVar8; ppNVar6 = ppNVar6 + 1) {
          if ((most_recent_input == (Node *)0x0) || (most_recent_input->mtime_ < (*ppNVar6)->mtime_)
             ) {
            most_recent_input = *ppNVar6;
          }
        }
        local_51 = false;
        bVar3 = DependencyScan::RecomputeOutputsDirty
                          (local_50,*__k,most_recent_input,&local_51,local_48);
        if (!bVar3) break;
        if (local_51 == false) {
          ppNVar7 = ((*__k)->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
          while (this_00 = *__k,
                ppNVar7 !=
                (this_00->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                super__Vector_impl_data._M_finish) {
            bVar3 = CleanNode(this,local_50,*ppNVar7,local_48);
            ppNVar7 = ppNVar7 + 1;
            if (!bVar3) goto LAB_00107b1b;
          }
          *(undefined4 *)&iVar4._M_node[1]._M_parent = 0;
          this->wanted_edges_ = this->wanted_edges_ + -1;
          bVar3 = Edge::is_phony(this_00);
          if (!bVar3) {
            this->command_edges_ = this->command_edges_ + -1;
          }
        }
      }
    }
  }
LAB_00107b1b:
  return __k == ppEVar1;
}

Assistant:

bool Plan::CleanNode(DependencyScan* scan, Node* node, string* err) {
  node->set_dirty(false);

  for (vector<Edge*>::const_iterator oe = node->out_edges().begin();
       oe != node->out_edges().end(); ++oe) {
    // Don't process edges that we don't actually want.
    map<Edge*, Want>::iterator want_e = want_.find(*oe);
    if (want_e == want_.end() || want_e->second == kWantNothing)
      continue;

    // Don't attempt to clean an edge if it failed to load deps.
    if ((*oe)->deps_missing_)
      continue;

    // If all non-order-only inputs for this edge are now clean,
    // we might have changed the dirty state of the outputs.
    vector<Node*>::iterator
        begin = (*oe)->inputs_.begin(),
        end = (*oe)->inputs_.end() - (*oe)->order_only_deps_;
#if __cplusplus < 201703L
#define MEM_FN mem_fun
#else
#define MEM_FN mem_fn  // mem_fun was removed in C++17.
#endif
    if (find_if(begin, end, MEM_FN(&Node::dirty)) == end) {
      // Recompute most_recent_input.
      Node* most_recent_input = NULL;
      for (vector<Node*>::iterator i = begin; i != end; ++i) {
        if (!most_recent_input || (*i)->mtime() > most_recent_input->mtime())
          most_recent_input = *i;
      }

      // Now, this edge is dirty if any of the outputs are dirty.
      // If the edge isn't dirty, clean the outputs and mark the edge as not
      // wanted.
      bool outputs_dirty = false;
      if (!scan->RecomputeOutputsDirty(*oe, most_recent_input,
                                       &outputs_dirty, err)) {
        return false;
      }
      if (!outputs_dirty) {
        for (vector<Node*>::iterator o = (*oe)->outputs_.begin();
             o != (*oe)->outputs_.end(); ++o) {
          if (!CleanNode(scan, *o, err))
            return false;
        }

        want_e->second = kWantNothing;
        --wanted_edges_;
        if (!(*oe)->is_phony())
          --command_edges_;
      }
    }
  }
  return true;
}